

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

bool LookupHelper<std::map<CKeyID,std::pair<CPubKey,KeyOriginInfo>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>,CKeyID,std::pair<CPubKey,KeyOriginInfo>>
               (map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                *map,CKeyID *key,pair<CPubKey,_KeyOriginInfo> *value)

{
  long lVar1;
  const_iterator cVar2;
  long lVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr *pp_Var5;
  pair<CPubKey,_KeyOriginInfo> *ppVar6;
  long in_FS_OFFSET;
  byte bVar7;
  
  bVar7 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          ::find(&map->_M_t,key);
  p_Var4 = &(map->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var4) {
    pp_Var5 = &cVar2._M_node[1]._M_right;
    ppVar6 = value;
    for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(_Base_ptr *)(ppVar6->first).vch = *pp_Var5;
      pp_Var5 = pp_Var5 + (ulong)bVar7 * -2 + 1;
      ppVar6 = (pair<CPubKey,_KeyOriginInfo> *)((long)ppVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    (value->first).vch[0x40] = *(uchar *)&cVar2._M_node[3]._M_right;
    *(_Rb_tree_color *)(value->second).fingerprint = cVar2._M_node[4]._M_color;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&(value->second).path,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&cVar2._M_node[4]._M_parent);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Rb_tree_header *)cVar2._M_node != p_Var4;
  }
  __stack_chk_fail();
}

Assistant:

bool LookupHelper(const M& map, const K& key, V& value)
{
    auto it = map.find(key);
    if (it != map.end()) {
        value = it->second;
        return true;
    }
    return false;
}